

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

char * testing::internal::StringFromGTestEnv(char *flag,char *default_value)

{
  char *pcVar1;
  char *in_RDX;
  string env_var;
  string local_38;
  
  FlagToEnvVar_abi_cxx11_(&local_38,(internal *)flag,in_RDX);
  pcVar1 = getenv(local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (pcVar1 != (char *)0x0) {
    default_value = pcVar1;
  }
  return default_value;
}

Assistant:

const char* StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const value = posix::GetEnv(env_var.c_str());
  return value == NULL ? default_value : value;
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
}